

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cxx
# Opt level: O1

void __thiscall Matrix::operator=(Matrix *this,double d)

{
  int iVar1;
  double *pdVar2;
  long lVar3;
  
  iVar1 = this->nData;
  if (0 < (long)iVar1) {
    pdVar2 = this->pData;
    lVar3 = 0;
    do {
      pdVar2[lVar3] = d;
      lVar3 = lVar3 + 1;
    } while (iVar1 != lVar3);
  }
  return;
}

Assistant:

void Matrix::operator=(double d)
{
    for(int i=0; i<nData; i++)
        pData[i] = d;
}